

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> * __thiscall
helics::Input::getValue_impl<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
          (void *param_1,Input *param_2)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x3722be);
  getValue_impl<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
            (param_2,param_1);
  return (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)param_1;
}

Assistant:

X getValue_impl(std::integral_constant<int, primaryType> /*V*/)
    {
        X val;  // NOLINT
        getValue_impl(std::integral_constant<int, primaryType>(), val);
        return val;
    }